

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
cbtSimulationIslandManager::buildIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld)

{
  int iVar1;
  cbtElement *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *this_00;
  cbtPersistentManifold **ptr;
  bool bVar4;
  cbtDispatcher *pcVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  cbtPersistentManifold **ppcVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  CProfileSample __profile;
  CProfileSample local_49;
  cbtSimulationIslandManager *local_48;
  cbtCollisionWorld *local_40;
  cbtDispatcher *local_38;
  cbtPersistentManifold *pcVar8;
  
  CProfileSample::CProfileSample(&local_49,"islandUnionFindAndQuickSort");
  iVar6 = (this->m_islandmanifold).m_size;
  lVar12 = (long)iVar6;
  if ((lVar12 < 1) && (iVar6 < 0)) {
    if ((this->m_islandmanifold).m_capacity < 0) {
      ppcVar9 = (this->m_islandmanifold).m_data;
      if (ppcVar9 != (cbtPersistentManifold **)0x0) {
        if ((this->m_islandmanifold).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ppcVar9);
        }
        (this->m_islandmanifold).m_data = (cbtPersistentManifold **)0x0;
      }
      (this->m_islandmanifold).m_ownsMemory = true;
      (this->m_islandmanifold).m_data = (cbtPersistentManifold **)0x0;
      (this->m_islandmanifold).m_capacity = 0;
    }
    if (iVar6 < 0) {
      do {
        (this->m_islandmanifold).m_data[lVar12] = (cbtPersistentManifold *)0x0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0);
    }
  }
  (this->m_islandmanifold).m_size = 0;
  local_38 = dispatcher;
  cbtUnionFind::sortIslands(&this->m_unionFind);
  iVar6 = (this->m_unionFind).m_elements.m_size;
  local_48 = this;
  local_40 = collisionWorld;
  if (0 < (long)iVar6) {
    iVar17 = 0;
    do {
      pcVar2 = (local_48->m_unionFind).m_elements.m_data;
      lVar12 = (long)iVar17;
      iVar7 = pcVar2[lVar12].m_id;
      iVar1 = iVar17 + 1;
      if (iVar17 + 1 < iVar6) {
        iVar1 = iVar6;
      }
      iVar11 = iVar17;
      lVar13 = lVar12;
      do {
        iVar10 = iVar11;
        lVar13 = lVar13 + 1;
        iVar11 = iVar1;
        iVar16 = iVar1 + -1;
        if (iVar6 <= lVar13) break;
        iVar11 = iVar10 + 1;
        iVar16 = iVar10;
      } while (pcVar2[lVar13].m_id == iVar7);
      if (iVar16 < iVar17) {
LAB_008db764:
        if (iVar17 <= iVar16) {
          iVar17 = (iVar16 - iVar17) + 1;
          do {
            pcVar3 = (collisionWorld->m_collisionObjects).m_data
                     [(local_48->m_unionFind).m_elements.m_data[lVar12].m_sz];
            if (pcVar3->m_islandTag1 == iVar7) {
              cbtCollisionObject::setActivationState(pcVar3,2);
            }
            lVar12 = lVar12 + 1;
            iVar17 = iVar17 + -1;
          } while (iVar17 != 0);
        }
      }
      else {
        lVar13 = lVar12;
        bVar14 = true;
        do {
          pcVar3 = (collisionWorld->m_collisionObjects).m_data[pcVar2[lVar13].m_sz];
          if (pcVar3->m_islandTag1 == iVar7) {
            iVar1 = pcVar3->m_activationState1;
            bVar4 = true;
            bVar15 = false;
            if ((iVar1 != 1) && (iVar1 != 4)) goto LAB_008db744;
          }
          else {
LAB_008db744:
            bVar4 = false;
            bVar15 = bVar14;
          }
        } while ((!bVar4) && (bVar4 = lVar13 < iVar16, lVar13 = lVar13 + 1, bVar14 = bVar15, bVar4))
        ;
        if (bVar15) goto LAB_008db764;
        if (iVar17 <= iVar16) {
          iVar17 = (iVar16 - iVar17) + 1;
          do {
            pcVar3 = (collisionWorld->m_collisionObjects).m_data
                     [(local_48->m_unionFind).m_elements.m_data[lVar12].m_sz];
            if ((pcVar3->m_islandTag1 == iVar7) && (pcVar3->m_activationState1 == 2)) {
              cbtCollisionObject::setActivationState(pcVar3,3);
              pcVar3->m_deactivationTime = 0.0;
            }
            lVar12 = lVar12 + 1;
            iVar17 = iVar17 + -1;
            collisionWorld = local_40;
          } while (iVar17 != 0);
        }
      }
      iVar17 = iVar11;
    } while (iVar11 < iVar6);
  }
  pcVar5 = local_38;
  iVar6 = (*local_38->_vptr_cbtDispatcher[9])(local_38);
  if (0 < iVar6) {
    iVar17 = 0;
    do {
      iVar7 = (*pcVar5->_vptr_cbtDispatcher[10])(pcVar5);
      pcVar8 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar7);
      if (((collisionWorld->m_dispatchInfo).m_deterministicOverlappingPairs != true) ||
         (pcVar8->m_cachedPoints != 0)) {
        pcVar3 = pcVar8->m_body0;
        this_00 = pcVar8->m_body1;
        if (((pcVar3 != (cbtCollisionObject *)0x0) && (pcVar3->m_activationState1 != 2)) ||
           ((this_00 != (cbtCollisionObject *)0x0 && (this_00->m_activationState1 != 2)))) {
          if (((pcVar3->m_collisionFlags & 2U) != 0) &&
             (((pcVar3->m_collisionFlags & 4U) == 0 && (pcVar3->m_activationState1 != 2)))) {
            cbtCollisionObject::activate(this_00,false);
          }
          if ((((this_00->m_collisionFlags & 2U) != 0) && ((this_00->m_collisionFlags & 4U) == 0))
             && (this_00->m_activationState1 != 2)) {
            cbtCollisionObject::activate(pcVar3,false);
          }
          if ((local_48->m_splitIslands == true) &&
             (iVar7 = (*pcVar5->_vptr_cbtDispatcher[7])(pcVar5,pcVar3,this_00), (char)iVar7 != '\0')
             ) {
            iVar7 = (local_48->m_islandmanifold).m_size;
            iVar1 = (local_48->m_islandmanifold).m_capacity;
            if (iVar7 == iVar1) {
              iVar11 = iVar7 * 2;
              if (iVar7 == 0) {
                iVar11 = 1;
              }
              if (iVar1 < iVar11) {
                if (iVar11 == 0) {
                  ppcVar9 = (cbtPersistentManifold **)0x0;
                }
                else {
                  ppcVar9 = (cbtPersistentManifold **)
                            cbtAlignedAllocInternal((long)iVar11 << 3,0x10);
                }
                lVar12 = (long)(local_48->m_islandmanifold).m_size;
                if (0 < lVar12) {
                  lVar13 = 0;
                  do {
                    ppcVar9[lVar13] = (local_48->m_islandmanifold).m_data[lVar13];
                    lVar13 = lVar13 + 1;
                  } while (lVar12 != lVar13);
                }
                ptr = (local_48->m_islandmanifold).m_data;
                if (ptr != (cbtPersistentManifold **)0x0) {
                  if ((local_48->m_islandmanifold).m_ownsMemory == true) {
                    cbtAlignedFreeInternal(ptr);
                  }
                  (local_48->m_islandmanifold).m_data = (cbtPersistentManifold **)0x0;
                }
                (local_48->m_islandmanifold).m_ownsMemory = true;
                (local_48->m_islandmanifold).m_data = ppcVar9;
                (local_48->m_islandmanifold).m_capacity = iVar11;
              }
            }
            iVar7 = (local_48->m_islandmanifold).m_size;
            (local_48->m_islandmanifold).m_data[iVar7] = pcVar8;
            (local_48->m_islandmanifold).m_size = iVar7 + 1;
          }
        }
      }
      iVar17 = iVar17 + 1;
      collisionWorld = local_40;
    } while (iVar17 != iVar6);
  }
  CProfileSample::~CProfileSample(&local_49);
  return;
}

Assistant:

void cbtSimulationIslandManager::buildIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld)
{
	BT_PROFILE("islandUnionFindAndQuickSort");

	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	m_islandmanifold.resize(0);

	//we are going to sort the unionfind array, and store the element id in the size
	//afterwards, we clean unionfind, to make sure no-one uses it anymore

	getUnionFind().sortIslands();
	int numElem = getUnionFind().getNumElements();

	int endIslandIndex = 1;
	int startIslandIndex;

	//update the sleeping state for bodies, if all are sleeping
	for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
	{
		int islandId = getUnionFind().getElement(startIslandIndex).m_id;
		for (endIslandIndex = startIslandIndex + 1; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
		{
		}

		//int numSleeping = 0;

		bool allSleeping = true;

		int idx;
		for (idx = startIslandIndex; idx < endIslandIndex; idx++)
		{
			int i = getUnionFind().getElement(idx).m_sz;

			cbtCollisionObject* colObj0 = collisionObjects[i];
			if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
			{
				//				printf("error in island management\n");
			}

			cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));
			if (colObj0->getIslandTag() == islandId)
			{
				if (colObj0->getActivationState() == ACTIVE_TAG ||
					colObj0->getActivationState() == DISABLE_DEACTIVATION)
				{
					allSleeping = false;
					break;
				}
			}
		}

		if (allSleeping)
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					colObj0->setActivationState(ISLAND_SLEEPING);
				}
			}
		}
		else
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;

				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					if (colObj0->getActivationState() == ISLAND_SLEEPING)
					{
						colObj0->setActivationState(WANTS_DEACTIVATION);
						colObj0->setDeactivationTime(0.f);
					}
				}
			}
		}
	}

	int i;
	int maxNumManifolds = dispatcher->getNumManifolds();

	//#define SPLIT_ISLANDS 1
	//#ifdef SPLIT_ISLANDS

	//#endif //SPLIT_ISLANDS

	for (i = 0; i < maxNumManifolds; i++)
	{
		cbtPersistentManifold* manifold = dispatcher->getManifoldByIndexInternal(i);
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			if (manifold->getNumContacts() == 0)
				continue;
		}

		const cbtCollisionObject* colObj0 = static_cast<const cbtCollisionObject*>(manifold->getBody0());
		const cbtCollisionObject* colObj1 = static_cast<const cbtCollisionObject*>(manifold->getBody1());

		///@todo: check sleeping conditions!
		if (((colObj0) && colObj0->getActivationState() != ISLAND_SLEEPING) ||
			((colObj1) && colObj1->getActivationState() != ISLAND_SLEEPING))
		{
			//kinematic objects don't merge islands, but wake up all connected objects
			if (colObj0->isKinematicObject() && colObj0->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj0->hasContactResponse())
					colObj1->activate();
			}
			if (colObj1->isKinematicObject() && colObj1->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj1->hasContactResponse())
					colObj0->activate();
			}
			if (m_splitIslands)
			{
				//filtering for response
				if (dispatcher->needsResponse(colObj0, colObj1))
					m_islandmanifold.push_back(manifold);
			}
		}
	}
}